

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

ssize_t __thiscall
wasm::WasmBinaryWriter::write(WasmBinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ssize_t extraout_RAX;
  WasmBinaryWriter *this_local;
  
  writeHeader(this);
  writeDylinkSection(this);
  initializeDebugInfo(this);
  if (this->sourceMap != (ostream *)0x0) {
    writeSourceMapProlog(this);
  }
  writeTypes(this);
  writeImports(this);
  writeFunctionSignatures(this);
  writeTableDeclarations(this);
  writeMemories(this);
  writeTags(this);
  bVar1 = FeatureSet::hasStrings(&this->wasm->features);
  if (bVar1) {
    writeStrings(this);
  }
  writeGlobals(this);
  writeExports(this);
  writeStart(this);
  writeElementSegments(this);
  writeDataCount(this);
  writeFunctions(this);
  writeDataSegments(this);
  if (((this->debugInfo & 1U) != 0) || ((this->emitModuleName & 1U) != 0)) {
    writeNames(this);
  }
  if ((this->sourceMap != (ostream *)0x0) &&
     (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    writeSourceMapUrl(this);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    writeSymbolMap(this);
  }
  if (this->sourceMap != (ostream *)0x0) {
    writeSourceMapEpilog(this);
  }
  bVar1 = Debug::hasDWARFSections(this->wasm);
  if (bVar1) {
    Debug::writeDWARFSections(this->wasm,&this->binaryLocations);
  }
  writeLateCustomSections(this);
  writeFeaturesSection(this);
  return extraout_RAX;
}

Assistant:

void WasmBinaryWriter::write() {
  writeHeader();

  writeDylinkSection();

  initializeDebugInfo();
  if (sourceMap) {
    writeSourceMapProlog();
  }

  writeTypes();
  writeImports();
  writeFunctionSignatures();
  writeTableDeclarations();
  writeMemories();
  writeTags();
  if (wasm->features.hasStrings()) {
    writeStrings();
  }
  writeGlobals();
  writeExports();
  writeStart();
  writeElementSegments();
  writeDataCount();
  writeFunctions();
  writeDataSegments();
  if (debugInfo || emitModuleName) {
    writeNames();
  }
  if (sourceMap && !sourceMapUrl.empty()) {
    writeSourceMapUrl();
  }
  if (symbolMap.size() > 0) {
    writeSymbolMap();
  }

  if (sourceMap) {
    writeSourceMapEpilog();
  }

#ifdef BUILD_LLVM_DWARF
  // Update DWARF user sections after writing the data they refer to
  // (function bodies), and before writing the user sections themselves.
  if (Debug::hasDWARFSections(*wasm)) {
    Debug::writeDWARFSections(*wasm, binaryLocations);
  }
#endif

  writeLateCustomSections();
  writeFeaturesSection();
}